

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall mocker::RenameASTDeclarations::operator()(RenameASTDeclarations *this,ForStmt *node)

{
  shared_ptr<mocker::ast::ASTNode> local_28;
  ForStmt *local_18;
  ForStmt *node_local;
  RenameASTDeclarations *this_local;
  
  local_18 = node;
  node_local = (ForStmt *)this;
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
            (&local_28,&node->body);
  visit(this,&local_28);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  return;
}

Assistant:

void operator()(ast::ForStmt &node) const override { visit(node.body); }